

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx512bw_blend_popcnt_unroll4(uint16_t *data,uint32_t len,uint32_t *flags)

{
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined8 uVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  int j;
  int i_2;
  __m512i input1_1;
  __m512i input0_1;
  __m512i v1_1;
  __m512i v0_1;
  int i_1;
  __m512i input3;
  __m512i input2;
  __m512i input1;
  __m512i input0;
  __m512i v3;
  __m512i v2;
  __m512i v1;
  __m512i v0;
  size_t i;
  uint32_t n_cycles;
  __m512i *data_vectors;
  undefined4 local_e88;
  undefined4 local_e84;
  undefined1 local_e80 [64];
  undefined1 local_e40 [64];
  undefined4 local_d44;
  undefined1 local_d40 [64];
  undefined1 local_d00 [64];
  undefined1 local_cc0 [64];
  undefined1 local_c80 [64];
  undefined8 local_b28;
  
  for (local_b28 = 0; local_b28 + 4 <= (ulong)(in_ESI >> 5); local_b28 = local_b28 + 4) {
    auVar2 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_b28 * 0x40));
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + 0x40 + local_b28 * 0x40));
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar4 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + 0x80 + local_b28 * 0x40));
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar5 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + 0xc0 + local_b28 * 0x40));
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar2);
    auVar7 = vpbroadcastw_avx512bw(ZEXT216(0xff));
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar8 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar3);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vpsllw_avx512bw(auVar7,ZEXT416(8));
    auVar7 = vpternlogd_avx512f(auVar6,auVar8,auVar7,0xea);
    local_c80 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpbroadcastw_avx512bw(ZEXT216(0xff00));
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar6 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpsrlw_avx512bw(auVar2,ZEXT416(8));
    auVar2 = vpternlogd_avx512f(auVar7,auVar6,auVar2,0xea);
    local_cc0 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar4);
    auVar2 = vpbroadcastw_avx512bw(ZEXT216(0xff));
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar7 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar5);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpsllw_avx512bw(auVar2,ZEXT416(8));
    auVar2 = vpternlogd_avx512f(auVar3,auVar7,auVar2,0xea);
    local_d00 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar4);
    auVar2 = vpbroadcastw_avx512bw(ZEXT216(0xff00));
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar4 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar5);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpsrlw_avx512bw(auVar2,ZEXT416(8));
    auVar2 = vpternlogd_avx512f(auVar3,auVar4,auVar2,0xea);
    local_d40 = vmovdqa64_avx512f(auVar2);
    for (local_d44 = 0; local_d44 < 8; local_d44 = local_d44 + 1) {
      auVar2 = vmovdqa64_avx512f(local_c80);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar2 = vmovdqa64_avx512f(auVar2);
      uVar1 = vpmovb2m_avx512bw(auVar2);
      *(int *)(in_RDX + (long)(7 - local_d44) * 4) =
           *(int *)(in_RDX + (long)(7 - local_d44) * 4) + (int)POPCOUNT(uVar1);
      auVar2 = vmovdqa64_avx512f(local_cc0);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar2 = vmovdqa64_avx512f(auVar2);
      uVar1 = vpmovb2m_avx512bw(auVar2);
      *(int *)(in_RDX + (long)(0xf - local_d44) * 4) =
           *(int *)(in_RDX + (long)(0xf - local_d44) * 4) + (int)POPCOUNT(uVar1);
      auVar2 = vmovdqa64_avx512f(local_d00);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar2 = vmovdqa64_avx512f(auVar2);
      uVar1 = vpmovb2m_avx512bw(auVar2);
      *(int *)(in_RDX + (long)(7 - local_d44) * 4) =
           *(int *)(in_RDX + (long)(7 - local_d44) * 4) + (int)POPCOUNT(uVar1);
      auVar2 = vmovdqa64_avx512f(local_d40);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar2 = vmovdqa64_avx512f(auVar2);
      uVar1 = vpmovb2m_avx512bw(auVar2);
      *(int *)(in_RDX + (long)(0xf - local_d44) * 4) =
           *(int *)(in_RDX + (long)(0xf - local_d44) * 4) + (int)POPCOUNT(uVar1);
      auVar2 = vmovdqa64_avx512f(local_c80);
      auVar3 = vmovdqa64_avx512f(local_c80);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar2 = vpaddb_avx512bw(auVar2,auVar3);
      local_c80 = vmovdqa64_avx512f(auVar2);
      auVar2 = vmovdqa64_avx512f(local_cc0);
      auVar3 = vmovdqa64_avx512f(local_cc0);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar2 = vpaddb_avx512bw(auVar2,auVar3);
      local_cc0 = vmovdqa64_avx512f(auVar2);
      auVar2 = vmovdqa64_avx512f(local_d00);
      auVar3 = vmovdqa64_avx512f(local_d00);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar2 = vpaddb_avx512bw(auVar2,auVar3);
      local_d00 = vmovdqa64_avx512f(auVar2);
      auVar2 = vmovdqa64_avx512f(local_d40);
      auVar3 = vmovdqa64_avx512f(local_d40);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar2 = vpaddb_avx512bw(auVar2,auVar3);
      local_d40 = vmovdqa64_avx512f(auVar2);
    }
  }
  for (; local_b28 + 2 <= (ulong)(in_ESI >> 5); local_b28 = local_b28 + 2) {
    auVar2 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_b28 * 0x40));
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + 0x40 + local_b28 * 0x40));
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar5 = vmovdqa64_avx512f(auVar2);
    auVar4 = vpbroadcastw_avx512bw(ZEXT216(0xff));
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar7 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(auVar3);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar4 = vpsllw_avx512bw(auVar4,ZEXT416(8));
    auVar4 = vpternlogd_avx512f(auVar5,auVar7,auVar4,0xea);
    local_e40 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpbroadcastw_avx512bw(ZEXT216(0xff00));
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar5 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpsrlw_avx512bw(auVar2,ZEXT416(8));
    auVar2 = vpternlogd_avx512f(auVar4,auVar5,auVar2,0xea);
    local_e80 = vmovdqa64_avx512f(auVar2);
    for (local_e84 = 0; local_e84 < 8; local_e84 = local_e84 + 1) {
      auVar2 = vmovdqa64_avx512f(local_e40);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar2 = vmovdqa64_avx512f(auVar2);
      uVar1 = vpmovb2m_avx512bw(auVar2);
      *(int *)(in_RDX + (long)(7 - local_e84) * 4) =
           *(int *)(in_RDX + (long)(7 - local_e84) * 4) + (int)POPCOUNT(uVar1);
      auVar2 = vmovdqa64_avx512f(local_e80);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar2 = vmovdqa64_avx512f(auVar2);
      uVar1 = vpmovb2m_avx512bw(auVar2);
      *(int *)(in_RDX + (long)(0xf - local_e84) * 4) =
           *(int *)(in_RDX + (long)(0xf - local_e84) * 4) + (int)POPCOUNT(uVar1);
      auVar2 = vmovdqa64_avx512f(local_e40);
      auVar3 = vmovdqa64_avx512f(local_e40);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar2 = vpaddb_avx512bw(auVar2,auVar3);
      local_e40 = vmovdqa64_avx512f(auVar2);
      auVar2 = vmovdqa64_avx512f(local_e80);
      auVar3 = vmovdqa64_avx512f(local_e80);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar2 = vmovdqa64_avx512f(auVar2);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar2 = vpaddb_avx512bw(auVar2,auVar3);
      local_e80 = vmovdqa64_avx512f(auVar2);
    }
  }
  for (local_b28 = local_b28 << 5; local_b28 < in_ESI; local_b28 = local_b28 + 1) {
    for (local_e88 = 0; local_e88 < 0x10; local_e88 = local_e88 + 1) {
      *(int *)(in_RDX + (long)local_e88 * 4) =
           ((int)((uint)*(ushort *)(in_RDI + local_b28 * 2) & 1 << ((byte)local_e88 & 0x1f)) >>
           ((byte)local_e88 & 0x1f)) + *(int *)(in_RDX + (long)local_e88 * 4);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx512bw_blend_popcnt_unroll4(const uint16_t* data, uint32_t len, uint32_t* flags) { 
    const __m512i* data_vectors = (const __m512i*)(data);
    const uint32_t n_cycles = len / 32;

    size_t i = 0;
    for (/**/; i + 4 <= n_cycles; i += 4) {
#define L(p) __m512i v##p = _mm512_loadu_si512(data_vectors+i+p);
        L(0) L(1) L(2) L(3)

#define U0(p,k) __m512i input##p = _mm512_ternarylogic_epi32(v##p, _mm512_set1_epi16(0x00FF), _mm512_slli_epi16(v##k, 8), AND_OR);
#define U1(p,k) __m512i input##k = _mm512_ternarylogic_epi32(v##p, _mm512_set1_epi16((int16_t)0xFF00), _mm512_srli_epi16(v##k, 8), AND_OR);
#define U(p, k)  U0(p,k) U1(p,k)

        U(0,1) U(2,3)
        
        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u64(_mm512_movepi8_mask(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u64(_mm512_movepi8_mask(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A(2, 3)

#define P0(p) input##p = _mm512_add_epi8(input##p, input##p);
#define P(p, k) P0(p) P0(k)
            P(0,1) P(2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

    i *= 32;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((data[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P
    
    return 0;
}